

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int template_match(t_template *x1,t_template *x2)

{
  int iVar1;
  int iVar2;
  t_dataslot *ptVar3;
  t_dataslot *ptVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = x1->t_n;
  iVar2 = x2->t_n;
  iVar5 = 0;
  if (iVar2 <= iVar1) {
    if (iVar2 < iVar1) {
      ptVar4 = x1->t_vec + iVar2;
      iVar5 = iVar1 - iVar2;
      do {
        if (ptVar4->ds_type == 3) {
          return 0;
        }
        ptVar4 = ptVar4 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    if (iVar1 < iVar2) {
      post("add elements...");
    }
    iVar5 = 1;
    if (0 < (long)x2->t_n) {
      ptVar4 = x1->t_vec;
      ptVar3 = x2->t_vec;
      lVar6 = 0;
      do {
        if (((*(long *)((long)&ptVar4->ds_name + lVar6) != *(long *)((long)&ptVar3->ds_name + lVar6)
             ) || (iVar1 = *(int *)((long)&ptVar4->ds_type + lVar6),
                  iVar1 != *(int *)((long)&ptVar3->ds_type + lVar6))) ||
           ((iVar1 == 3 &&
            (*(long *)((long)&ptVar4->ds_arraytemplate + lVar6) !=
             *(long *)((long)&ptVar3->ds_arraytemplate + lVar6))))) {
          return 0;
        }
        lVar6 = lVar6 + 0x18;
      } while ((long)x2->t_n * 0x18 != lVar6);
    }
  }
  return iVar5;
}

Assistant:

int template_match(t_template *x1, t_template *x2)
{
    int i;
    if (x1->t_n < x2->t_n)
        return (0);
    for (i = x2->t_n; i < x1->t_n; i++)
    {
        if (x1->t_vec[i].ds_type == DT_ARRAY)
                return (0);
    }
    if (x2->t_n > x1->t_n)
        post("add elements...");
    for (i = 0; i < x2->t_n; i++)
        if (!dataslot_matches(&x1->t_vec[i], &x2->t_vec[i], 1))
            return (0);
    return (1);
}